

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# regex_optimizations.cpp
# Opt level: O1

LikeString *
duckdb::GetLikeStringEscaped(LikeString *__return_storage_ptr__,Regexp *regexp,bool contains)

{
  int codepoint;
  string *psVar1;
  long lVar2;
  bool bVar3;
  
  __return_storage_ptr__->exists = true;
  __return_storage_ptr__->escaped = false;
  (__return_storage_ptr__->like_string)._M_dataplus._M_p =
       (pointer)&(__return_storage_ptr__->like_string).field_2;
  (__return_storage_ptr__->like_string)._M_string_length = 0;
  (__return_storage_ptr__->like_string).field_2._M_local_buf[0] = '\0';
  if ((regexp->parse_flags_ & 0x11) == 0x10) {
    codepoint = (regexp->arguments).repeat.max_;
    if (regexp->op_ == '\x04') {
      if (codepoint != 0) {
        psVar1 = (regexp->arguments).capture.name_;
        lVar2 = 0;
        do {
          AddCodepoint(*(int32_t *)((long)&(psVar1->_M_dataplus)._M_p + lVar2 * 4),
                       __return_storage_ptr__,contains);
          if (__return_storage_ptr__->exists != true) {
            return __return_storage_ptr__;
          }
          bVar3 = (long)codepoint + -1 != lVar2;
          lVar2 = lVar2 + 1;
        } while (bVar3);
      }
    }
    else {
      AddCodepoint(codepoint,__return_storage_ptr__,contains);
    }
  }
  else {
    __return_storage_ptr__->exists = false;
  }
  return __return_storage_ptr__;
}

Assistant:

static LikeString GetLikeStringEscaped(duckdb_re2::Regexp *regexp, bool contains = false) {
	D_ASSERT(regexp->op() == duckdb_re2::kRegexpLiteralString || regexp->op() == duckdb_re2::kRegexpLiteral);
	LikeString ret;

	if (regexp->parse_flags() & duckdb_re2::Regexp::FoldCase ||
	    !(regexp->parse_flags() & duckdb_re2::Regexp::OneLine)) {
		// parse flags can turn on and off within a regex match, return no optimization
		// For now, we just don't optimize if these every turn on.
		// TODO: logic to attempt the optimization, then if the parse flags change, then abort
		ret.exists = false;
		return ret;
	}

	// case insensitivity may be on now, but it can also turn off.
	if (regexp->op() == duckdb_re2::kRegexpLiteralString) {
		auto nrunes = (idx_t)regexp->nrunes();
		auto runes = regexp->runes();
		for (idx_t i = 0; i < nrunes; i++) {
			AddCodepoint(runes[i], ret, contains);
			if (!ret.exists) {
				return ret;
			}
		}
	} else {
		auto rune = regexp->rune();
		AddCodepoint(rune, ret, contains);
	}
	D_ASSERT(ret.like_string.size() >= 1 || !ret.exists);
	return ret;
}